

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckScriptKeyboardAccessible(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  AttVal *local_40;
  AttVal *av;
  int HasOnMouseMove;
  int HasOnMouseOver;
  int HasOnMouseOut;
  int HasOnClick;
  int HasOnMouseUp;
  int HasOnMouseDown;
  Node *content;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  HasOnClick = 0;
  HasOnMouseOut = 0;
  HasOnMouseOver = 0;
  HasOnMouseMove = 0;
  av._4_4_ = 0;
  av._0_4_ = 0;
  BVar1 = Level2_Enabled(doc);
  if (BVar1 != no) {
    for (local_40 = node->attributes; local_40 != (AttVal *)0x0; local_40 = local_40->next) {
      if (((local_40 != (AttVal *)0x0) && (local_40->dict != (Attribute *)0x0)) &&
         (local_40->dict->id == TidyAttr_OnMOUSEDOWN)) {
        HasOnClick = HasOnClick + 1;
      }
      if (((local_40 != (AttVal *)0x0) && (local_40->dict != (Attribute *)0x0)) &&
         (local_40->dict->id == TidyAttr_OnMOUSEUP)) {
        HasOnMouseOut = HasOnMouseOut + 1;
      }
      if (((local_40 != (AttVal *)0x0) && (local_40->dict != (Attribute *)0x0)) &&
         (local_40->dict->id == TidyAttr_OnCLICK)) {
        HasOnMouseOver = HasOnMouseOver + 1;
      }
      if (((local_40 != (AttVal *)0x0) && (local_40->dict != (Attribute *)0x0)) &&
         (local_40->dict->id == TidyAttr_OnMOUSEOUT)) {
        HasOnMouseMove = HasOnMouseMove + 1;
      }
      if (((local_40 != (AttVal *)0x0) && (local_40->dict != (Attribute *)0x0)) &&
         (local_40->dict->id == TidyAttr_OnMOUSEOVER)) {
        av._4_4_ = av._4_4_ + 1;
      }
      if (((local_40 != (AttVal *)0x0) && (local_40->dict != (Attribute *)0x0)) &&
         (local_40->dict->id == TidyAttr_OnMOUSEMOVE)) {
        av._0_4_ = (int)av + 1;
      }
      if (((local_40 != (AttVal *)0x0) && (local_40->dict != (Attribute *)0x0)) &&
         (local_40->dict->id == TidyAttr_OnKEYDOWN)) {
        HasOnClick = HasOnClick + 1;
      }
      if (((local_40 != (AttVal *)0x0) && (local_40->dict != (Attribute *)0x0)) &&
         (local_40->dict->id == TidyAttr_OnKEYUP)) {
        HasOnMouseOut = HasOnMouseOut + 1;
      }
      if (((local_40 != (AttVal *)0x0) && (local_40->dict != (Attribute *)0x0)) &&
         (local_40->dict->id == TidyAttr_OnKEYPRESS)) {
        HasOnMouseOver = HasOnMouseOver + 1;
      }
      if (((local_40 != (AttVal *)0x0) && (local_40->dict != (Attribute *)0x0)) &&
         (local_40->dict->id == TidyAttr_OnBLUR)) {
        HasOnMouseMove = HasOnMouseMove + 1;
      }
    }
    if (HasOnClick == 1) {
      prvTidyReportAccessError(doc,node,0x183);
    }
    if (HasOnMouseOut == 1) {
      prvTidyReportAccessError(doc,node,0x184);
    }
    if (HasOnMouseOver == 1) {
      prvTidyReportAccessError(doc,node,0x185);
    }
    if (HasOnMouseMove == 1) {
      prvTidyReportAccessError(doc,node,0x187);
    }
    if (av._4_4_ == 1) {
      prvTidyReportAccessError(doc,node,0x186);
    }
    if ((int)av == 1) {
      prvTidyReportAccessError(doc,node,0x188);
    }
    for (_HasOnMouseUp = node->content; _HasOnMouseUp != (Node *)0x0;
        _HasOnMouseUp = _HasOnMouseUp->next) {
      CheckScriptKeyboardAccessible(doc,_HasOnMouseUp);
    }
  }
  return;
}

Assistant:

static void CheckScriptKeyboardAccessible( TidyDocImpl* doc, Node* node )
{
    Node* content;
    int HasOnMouseDown = 0;
    int HasOnMouseUp = 0;
    int HasOnClick = 0;
    int HasOnMouseOut = 0;
    int HasOnMouseOver = 0;
    int HasOnMouseMove = 0;

    if (Level2_Enabled( doc ))
    {
        AttVal* av;
        /* Checks all elements for their attributes */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /* Must also have 'ONKEYDOWN' attribute with 'ONMOUSEDOWN' */
            if ( attrIsOnMOUSEDOWN(av) )
                HasOnMouseDown++;

            /* Must also have 'ONKEYUP' attribute with 'ONMOUSEUP' */
            if ( attrIsOnMOUSEUP(av) )
                HasOnMouseUp++;

            /* Must also have 'ONKEYPRESS' attribute with 'ONCLICK' */
            if ( attrIsOnCLICK(av) )
                HasOnClick++;

            /* Must also have 'ONBLUR' attribute with 'ONMOUSEOUT' */
            if ( attrIsOnMOUSEOUT(av) )
                HasOnMouseOut++;

            if ( attrIsOnMOUSEOVER(av) )
                HasOnMouseOver++;

            if ( attrIsOnMOUSEMOVE(av) )
                HasOnMouseMove++;

            if ( attrIsOnKEYDOWN(av) )
                HasOnMouseDown++;

            if ( attrIsOnKEYUP(av) )
                HasOnMouseUp++;

            if ( attrIsOnKEYPRESS(av) )
                HasOnClick++;

            if ( attrIsOnBLUR(av) )
                HasOnMouseOut++;
        }

        if ( HasOnMouseDown == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_DOWN);

        if ( HasOnMouseUp == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_UP);

        if ( HasOnClick == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_CLICK);
        if ( HasOnMouseOut == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_OUT);

        if ( HasOnMouseOver == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_OVER);

        if ( HasOnMouseMove == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_MOVE);

        /* Recursively check all child nodes.
         */
        for ( content = node->content; content != NULL; content = content->next )
            CheckScriptKeyboardAccessible( doc, content );
    }
}